

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_build(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
         *this)

{
  ulong uVar1;
  Task *pTVar2;
  reference pvVar3;
  size_t sVar4;
  Graph *in_RDI;
  size_t l;
  FlowBuilder fb;
  string *in_stack_fffffffffffffee8;
  reference in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  FlowBuilder *in_stack_ffffffffffffff38;
  string local_b8 [32];
  string local_98 [40];
  ulong local_70;
  ulong local_60;
  undefined1 local_41 [49];
  FlowBuilder local_10 [2];
  
  FlowBuilder::FlowBuilder(local_10,in_RDI);
  FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_pipeline_hpp:1608:26),_nullptr>
            (in_stack_ffffffffffffff38,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff30);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,(allocator<char> *)__rhs);
  pTVar2 = Task::name(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pvVar3 = std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                     ((vector<tf::Task,_std::allocator<tf::Task>_> *)
                      &in_RDI[2].
                       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,0);
  Task::operator=(pvVar3,pTVar2);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  local_60 = 0;
  while( true ) {
    uVar1 = local_60;
    sVar4 = num_lines((ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                       *)0x1628ec);
    if (sVar4 <= uVar1) break;
    local_70 = local_60;
    FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_pipeline_hpp:1615:32),_nullptr>
              (in_stack_ffffffffffffff38,(anon_class_16_2_fd512dd9 *)in_stack_ffffffffffffff30);
    s_abi_cxx11_((char *)in_stack_ffffffffffffff28,(size_t)__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff28);
    std::operator+(in_stack_ffffffffffffff28,__rhs);
    pTVar2 = Task::name(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    pvVar3 = std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                       ((vector<tf::Task,_std::allocator<tf::Task>_> *)
                        &in_RDI[2].
                         super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_60 + 1);
    Task::operator=(pvVar3,pTVar2);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    std::__cxx11::string::~string(local_b8);
    in_stack_fffffffffffffef0 =
         std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                   ((vector<tf::Task,_std::allocator<tf::Task>_> *)
                    &in_RDI[2].
                     super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,0);
    std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
              ((vector<tf::Task,_std::allocator<tf::Task>_> *)
               &in_RDI[2].
                super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                .
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,local_60 + 1);
    Task::precede<tf::Task&>(in_stack_fffffffffffffef0,(Task *)in_stack_fffffffffffffee8);
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

void ScalablePipeline<P>::_build() {

  using namespace std::literals::string_literals;

  FlowBuilder fb(_graph);
  
  // init task
  _tasks[0] = fb.emplace([this]() {
    return static_cast<int>(_num_tokens % num_lines());
  }).name("cond");

  // line task
  for(size_t l = 0; l < num_lines(); l++) {
    
    _tasks[l + 1] = fb.emplace([this, l] (tf::Runtime& rt) mutable {

      auto pf = &_pipeflows[l];

      pipeline:

      _line(pf->_line, pf->_pipe).join_counter.store(
        static_cast<size_t>(_pipes[pf->_pipe]->type()), std::memory_order_relaxed
      );

      // First pipe does all jobs of initialization and token dependencies
      if (pf->_pipe == 0) {
        // _ready_tokens queue is not empty
        // substitute pf with the token at the front of the queue
        if (!_ready_tokens.empty()) {
          pf->_token = _ready_tokens.front().first;
          pf->_num_deferrals = _ready_tokens.front().second;
          _ready_tokens.pop();
        }
        else {
          pf->_token = _num_tokens;
          pf->_num_deferrals = 0;
        }
      
      handle_token_dependency: 

        if (pf->_stop = false, _on_pipe(*pf, rt); pf->_stop == true) {
          // here, the pipeline is not stopped yet because other
          // lines of tasks may still be running their last stages
          return;
        }
        
        if (_num_tokens == pf->_token) {
          ++_num_tokens;
        }
      
        if (pf->_dependents.empty() == false){ 
          // check if the pf->_dependents have valid dependents
          _check_dependents(*pf); 
          
          // tokens in pf->_dependents are all valid dependents 
          if (pf->_dependents.size()) {
            
            // construct a data structure for pf in _deferred_tokens 
            _construct_deferred_tokens(*pf);
            goto pipeline;
          }

          // tokens in pf->_dependents are invalid dependents
          // directly goto on_pipe on the same line
          else {
            goto handle_token_dependency;
          }
        }
        
        // Every token within the deferral range needs to check
        // if it can resolve dependencies on other tokens.
        if (pf->_token <= _longest_deferral) {
          _resolve_token_dependencies(*pf); 
        }
      }
      else {
        _on_pipe(*pf, rt);
      }
      
      size_t c_f = pf->_pipe;
      size_t n_f = (pf->_pipe + 1) % num_pipes();
      size_t n_l = (pf->_line + 1) % num_lines();
      
      pf->_pipe = n_f;

      // ---- scheduling starts here ----
      // Notice that the shared variable f must not be changed after this
      // point because it can result in data race due to the following
      // condition:
      //
      // a -> b
      // |    |
      // v    v
      // c -> d
      //
      // d will be spawned by either c or b, so if c changes f but b spawns d
      // then data race on f will happen

      std::array<int, 2> retval;
      size_t n = 0;

      // downward dependency
      if(_pipes[c_f]->type() == PipeType::SERIAL &&
         _line(n_l, c_f).join_counter.fetch_sub(
           1, std::memory_order_acq_rel) == 1
        ) {
        retval[n++] = 1;
      }

      // forward dependency
      if(_line(pf->_line, n_f).join_counter.fetch_sub(
          1, std::memory_order_acq_rel) == 1
        ) {
        retval[n++] = 0;
      }

      // notice that the task index starts from 1
      switch(n) {
        case 2: {
          rt.schedule(_tasks[n_l+1]);
          goto pipeline;
        }
        case 1: {
          if (retval[0] == 1) {
            pf = &_pipeflows[n_l];
          }
          goto pipeline;
        }
      }
    }).name("rt-"s + std::to_string(l));

    _tasks[0].precede(_tasks[l+1]);
  }
}